

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O2

CURLcode Curl_pp_statemach(pingpong *pp,_Bool block)

{
  uint uVar1;
  connectdata *conn;
  SessionHandle *data;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  ulong timeout_ms;
  timeval now;
  
  conn = pp->conn;
  uVar1 = conn->sock[0];
  uVar6 = Curl_pp_state_timeout(pp);
  data = conn->data;
  if ((long)uVar6 < 1) {
    Curl_failf(data,"server response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  _Var2 = Curl_pp_moredata(pp);
  if (_Var2) {
    iVar3 = 1;
  }
  else {
    timeout_ms = 1000;
    if (uVar6 < 1000) {
      timeout_ms = uVar6;
    }
    if (!block) {
      timeout_ms = 0;
    }
    iVar3 = Curl_socket_check(-(uint)(pp->sendleft != 0) | uVar1,-1,
                              -(uint)(pp->sendleft == 0) | uVar1,timeout_ms);
  }
  if (block) {
    iVar4 = Curl_pgrsUpdate(conn);
    if (iVar4 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    now = curlx_tvnow();
    CVar5 = Curl_speedcheck(data,now);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
  }
  if (iVar3 == 0) {
    CVar5 = CURLE_OK;
  }
  else {
    if (iVar3 != -1) {
      CVar5 = (*pp->statemach_act)(conn);
      return CVar5;
    }
    Curl_failf(data,"select/poll error");
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_pp_statemach(struct pingpong *pp, bool block)
{
  struct connectdata *conn = pp->conn;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int rc;
  long interval_ms;
  long timeout_ms = Curl_pp_state_timeout(pp);
  struct SessionHandle *data=conn->data;
  CURLcode result = CURLE_OK;

  if(timeout_ms <=0 ) {
    failf(data, "server response timeout");
    return CURLE_OPERATION_TIMEDOUT; /* already too little time */
  }

  if(block) {
    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout_ms < interval_ms)
      interval_ms = timeout_ms;
  }
  else
    interval_ms = 0; /* immediate */

  if(Curl_pp_moredata(pp))
    /* We are receiving and there is data in the cache so just read it */
    rc = 1;
  else if(!pp->sendleft && Curl_ssl_data_pending(conn, FIRSTSOCKET))
    /* We are receiving and there is data ready in the SSL library */
    rc = 1;
  else
    rc = Curl_socket_ready(pp->sendleft?CURL_SOCKET_BAD:sock, /* reading */
                           pp->sendleft?sock:CURL_SOCKET_BAD, /* writing */
                           interval_ms);

  if(block) {
    /* if we didn't wait, we don't have to spend time on this now */
    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_tvnow());

    if(result)
      return result;
  }

  if(rc == -1) {
    failf(data, "select/poll error");
    result = CURLE_OUT_OF_MEMORY;
  }
  else if(rc)
    result = pp->statemach_act(conn);

  return result;
}